

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool absl::lts_20250127::anon_unknown_58::IsSubstringInCordAt
               (CharIterator position,string_view needle)

{
  bool bVar1;
  unsigned_long *puVar2;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view expected;
  Nonnull<absl::string_view_*> local_58;
  char *local_50;
  size_type local_48;
  size_type local_40;
  size_type local_38;
  unsigned_long min_length;
  string_view haystack_chunk;
  string_view needle_local;
  
  haystack_chunk._M_str = (char *)needle._M_len;
  _min_length = Cord::ChunkRemaining(&position);
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&min_length);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!haystack_chunk.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                    ,0x4ad,
                    "bool absl::lts_20250127::(anonymous namespace)::IsSubstringInCordAt(absl::Cord::CharIterator, absl::string_view)"
                   );
    }
    local_40 = std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&min_length);
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&haystack_chunk._M_str
                         );
    puVar2 = std::min<unsigned_long>(&local_40,&local_48);
    local_38 = *puVar2;
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&min_length,0,local_38);
    local_58 = (Nonnull<absl::string_view_*>)bVar3._M_len;
    local_50 = bVar3._M_str;
    expected._M_str = in_RCX;
    expected._M_len = (size_t)local_50;
    bVar1 = ConsumePrefix((lts_20250127 *)&haystack_chunk._M_str,local_58,expected);
    if (!bVar1) break;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&haystack_chunk._M_str);
    if (bVar1) {
      return true;
    }
    Cord::Advance(&position,local_38);
    _min_length = Cord::ChunkRemaining(&position);
  }
  return false;
}

Assistant:

bool IsSubstringInCordAt(absl::Cord::CharIterator position,
                         absl::string_view needle) {
  auto haystack_chunk = absl::Cord::ChunkRemaining(position);
  while (true) {
    // Precondition is that `absl::Cord::ChunkRemaining(position)` is not
    // empty. This assert will trigger if that is not true.
    assert(!haystack_chunk.empty());
    auto min_length = std::min(haystack_chunk.size(), needle.size());
    if (!absl::ConsumePrefix(&needle, haystack_chunk.substr(0, min_length))) {
      return false;
    }
    if (needle.empty()) {
      return true;
    }
    absl::Cord::Advance(&position, min_length);
    haystack_chunk = absl::Cord::ChunkRemaining(position);
  }
}